

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_unsigned_long>
google::protobuf::internal::VarintParseSlow64(char *p,uint32 res32)

{
  uint in_ESI;
  long in_RDI;
  uint64 byte;
  uint32_t i;
  uint64 res;
  int local_4c;
  void *local_48;
  char *local_40;
  ulong local_38;
  uint local_2c;
  ulong local_28 [3];
  pair<const_char_*,_unsigned_long> local_10;
  
  local_28[0] = (ulong)in_ESI;
  local_2c = 2;
  while( true ) {
    if (9 < local_2c) {
      local_48 = (void *)0x0;
      local_4c = 0;
      std::pair<const_char_*,_unsigned_long>::pair<std::nullptr_t,_int,_true>
                (&local_10,&local_48,&local_4c);
      return local_10;
    }
    local_38 = (ulong)*(byte *)(in_RDI + (ulong)local_2c);
    local_28[0] = (local_38 - 1 << ((char)local_2c * '\a' & 0x3fU)) + local_28[0];
    if (local_38 < 0x80) break;
    local_2c = local_2c + 1;
  }
  local_40 = (char *)(in_RDI + (ulong)local_2c + 1);
  std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long_&,_true>
            (&local_10,&local_40,local_28);
  return local_10;
}

Assistant:

std::pair<const char*, uint64> VarintParseSlow64(const char* p, uint32 res32) {
  uint64 res = res32;
  for (std::uint32_t i = 2; i < 10; i++) {
    uint64 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}